

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::LessThanTest<unsigned_long_long,unsigned_long_long>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  lhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  lhs_00;
  bool bVar1;
  int *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  uint uVar2;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
  rhs.m_int._4_4_ = in_stack_ffffffffffffffc4;
  rhs.m_int._0_4_ = in_stack_ffffffffffffffc0;
  bVar1 = ::operator<((unsigned_long_long)in_stack_ffffffffffffffb8,rhs);
  uVar2 = in_stack_ffffffffffffffc0 & 0xffffff;
  uVar3 = uVar2;
  if (bVar1) {
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) &
                      0xffffffff00ffffff),in_stack_ffffffffffffffb8);
    lhs.m_int._4_4_ = in_stack_ffffffffffffffd4;
    lhs.m_int._0_4_ = in_stack_ffffffffffffffd0;
    bVar1 = ::operator<(lhs,in_stack_ffffffffffffffc8.m_int);
    uVar3 = uVar2 & 0xffffff;
    if (bVar1) {
      uVar4 = 6;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)(CONCAT44(in_stack_ffffffffffffffc4,uVar2) & 0xffffffff00ffffff),
                     in_stack_ffffffffffffffb8);
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(7,uVar3),in_stack_ffffffffffffffb8);
      lhs_00.m_int._4_4_ = uVar4;
      lhs_00.m_int._0_4_ = in_stack_ffffffffffffffd0;
      bVar1 = ::operator<(lhs_00,in_stack_ffffffffffffffc8);
      uVar3 = (uint)bVar1 << 0x18;
    }
  }
  return SUB41(uVar3 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanTest()
	{
		return
			(U)2 < SafeInt<T>(3) &&
			SafeInt<T>(4) < (U)5 &&
			SafeInt<T>(6) < SafeInt<U>(7);
	}